

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O2

t_int * cos_perform(t_int *w)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  t_int tVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  pfVar5 = cos_table;
  pfVar2 = (float *)w[1];
  lVar3 = w[2];
  tVar4 = w[3];
  fVar1 = *pfVar2;
  lVar6 = 0;
  while( true ) {
    dVar8 = (double)(fVar1 * 512.0) + 1572864.0;
    uVar7 = (ulong)((uint)((ulong)dVar8 >> 0x20) & 0x1ff);
    dVar8 = (double)((ulong)dVar8 & 0xffffffff | 0x4138000000000000);
    if ((int)tVar4 + -1 == (int)lVar6) break;
    fVar1 = pfVar2[lVar6 + 1];
    *(float *)(lVar3 + lVar6 * 4) =
         (pfVar5[uVar7 + 1] - pfVar5[uVar7]) * (float)(dVar8 + -1572864.0) + pfVar5[uVar7];
    lVar6 = lVar6 + 1;
  }
  *(float *)(lVar3 + lVar6 * 4) =
       (pfVar5[uVar7 + 1] - pfVar5[uVar7]) * (float)(dVar8 + -1572864.0) + pfVar5[uVar7];
  return w + 4;
}

Assistant:

static t_int *cos_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    float *tab = cos_table, *addr;
    t_float f1, f2, frac;
    double dphase;
    int normhipart;
    union tabfudge tf;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];

#if 0           /* this is the readable version of the code. */
    while (n--)
    {
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
        tf.tf_d = dphase;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        *out++ = f1 + frac * (f2 - f1);
    }
#endif
#if 1           /* this is the same, unwrapped by hand. */
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
        tf.tf_d = dphase;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
    while (--n)
    {
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
            frac = tf.tf_d - UNITBIT32;
        tf.tf_d = dphase;
            f1 = addr[0];
            f2 = addr[1];
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
            *out++ = f1 + frac * (f2 - f1);
        tf.tf_i[HIOFFSET] = normhipart;
    }
            frac = tf.tf_d - UNITBIT32;
            f1 = addr[0];
            f2 = addr[1];
            *out++ = f1 + frac * (f2 - f1);
#endif
    return (w+4);
}